

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

ParamAssignmentSyntax * __thiscall slang::parsing::Parser::parseParamValue(Parser *this)

{
  bool bVar1;
  OrderedParamAssignmentSyntax *pOVar2;
  SourceLocation location;
  ExpressionSyntax *pEVar3;
  NamedParamAssignmentSyntax *pNVar4;
  Token dot;
  Token name;
  Token closeParen;
  Token start;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
  if (bVar1) {
    dot = ParserBase::consume(&this->super_ParserBase);
    name = ParserBase::expect(&this->super_ParserBase,Identifier);
    start = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    if ((start._0_4_ >> 0x10 & 1) == 0) {
      bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
      if (bVar1) {
        pEVar3 = (ExpressionSyntax *)0x0;
      }
      else {
        pEVar3 = parseMinTypMaxExpression
                           (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      }
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    }
    else {
      location = Token::location(&start);
      closeParen = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,location);
      pEVar3 = (ExpressionSyntax *)0x0;
    }
    pNVar4 = slang::syntax::SyntaxFactory::namedParamAssignment
                       (&this->factory,dot,name,start,pEVar3,closeParen);
    return &pNVar4->super_ParamAssignmentSyntax;
  }
  pEVar3 = parseMinTypMaxExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
  pOVar2 = slang::syntax::SyntaxFactory::orderedParamAssignment(&this->factory,pEVar3);
  return &pOVar2->super_ParamAssignmentSyntax;
}

Assistant:

ParamAssignmentSyntax& Parser::parseParamValue() {
    // check for named arguments
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        auto [innerOpenParen, innerCloseParen,
              expr] = parseGroupOrSkip(TokenKind::OpenParenthesis, TokenKind::CloseParenthesis,
                                       [this]() { return &parseMinTypMaxExpression(); });

        return factory.namedParamAssignment(dot, name, innerOpenParen, expr, innerCloseParen);
    }

    return factory.orderedParamAssignment(parseMinTypMaxExpression());
}